

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O0

bool FormatBoot(string *path)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  uint8_t *pv;
  undefined1 local_70 [8];
  MEMORY mem;
  string local_48;
  undefined1 local_28 [8];
  shared_ptr<HDD> hdd;
  bool fRet;
  string *path_local;
  
  hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::__cxx11::string::rfind((char)path,0x3a);
  std::__cxx11::string::substr((ulong)&local_48,(ulong)path);
  HDD::OpenDisk((HDD *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  peVar5 = std::__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  if (peVar5 != (element_type *)0x0) {
    peVar6 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    bVar2 = HDD::Seek(peVar6,0);
    if (bVar2) {
      peVar6 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_28);
      uVar3 = (*peVar6->_vptr_HDD[2])();
      if ((uVar3 & 1) != 0) {
        peVar6 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_28);
        uVar3 = (*peVar6->_vptr_HDD[3])();
        if ((uVar3 & 1) != 0) {
          peVar6 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              local_28);
          MEMORY::MEMORY((MEMORY *)local_70,peVar6->sector_size);
          peVar6 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              local_28);
          pv = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_70);
          iVar4 = HDD::Write(peVar6,pv,1,false);
          if (iVar4 == 0) {
            Error("write");
          }
          else {
            hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
          }
          peVar6 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              local_28);
          (*peVar6->_vptr_HDD[4])();
          MEMORY::~MEMORY((MEMORY *)local_70);
        }
      }
      goto LAB_001e5ccb;
    }
  }
  Error("open");
LAB_001e5ccb:
  bVar1 = hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_;
  std::shared_ptr<HDD>::~shared_ptr((shared_ptr<HDD> *)local_28);
  return (bool)(bVar1 & 1);
}

Assistant:

bool FormatBoot(const std::string& path)
{
    bool fRet = false;

    // Strip ":0" from end of string
    auto hdd = HDD::OpenDisk(path.substr(0, path.rfind(':')));

    if (!hdd.get() || !hdd->Seek(0))
        Error("open");
    else if (hdd->SafetyCheck() && hdd->Lock())
    {
        MEMORY mem(hdd->sector_size);

        if (!hdd->Write(mem, 1))
            Error("write");
        else
            fRet = true;

        hdd->Unlock();
    }

    return fRet;
}